

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

StringTree * __thiscall
capnp::JsonCodec::Impl::encodeList
          (StringTree *__return_storage_ptr__,Impl *this,Array<kj::StringTree> *elements,
          bool hasMultilineElement,uint indent,bool *multiline,bool hasPrefix)

{
  ulong uVar1;
  Branch *pBVar2;
  StringTree *pSVar3;
  undefined7 in_register_00000009;
  char *pcVar4;
  char *pcVar5;
  undefined4 in_register_00000084;
  ArrayPtr<const_char> *params_2;
  ArrayPtr<const_char> *pAVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  ArrayDisposer *pAVar11;
  long lVar12;
  size_t sVar13;
  bool bVar14;
  StringPtr delim;
  String ownPrefix;
  char *pcVar15;
  undefined8 *local_c8;
  char *local_b8;
  ArrayPtr<const_char> *pAStack_b0;
  undefined8 *local_a8;
  StringTree local_98;
  Repeat<char> *local_60;
  StringTree *local_58;
  ArrayPtr<const_char> local_50;
  char *local_40;
  ArrayDisposer *local_38;
  
  params_2 = (ArrayPtr<const_char> *)CONCAT44(in_register_00000084,indent);
  uVar1 = elements->size_;
  if (uVar1 == 0) {
    bVar14 = false;
  }
  else {
    lVar12 = 0;
    uVar7 = 0;
    do {
      uVar8 = *(ulong *)((long)&elements->ptr->size_ + lVar12);
      if (uVar8 < uVar7) {
        uVar8 = uVar7;
      }
      lVar12 = lVar12 + 0x38;
      uVar7 = uVar8;
    } while (uVar1 * 0x38 - lVar12 != 0);
    bVar14 = 0x32 < uVar8;
  }
  local_b8 = (char *)0x0;
  pAStack_b0 = (ArrayPtr<const_char> *)0x0;
  local_a8 = (undefined8 *)0x0;
  local_c8 = (undefined8 *)0x0;
  pcVar15 = (char *)0x0;
  pAVar6 = (ArrayPtr<const_char> *)0x0;
  pcVar10 = "";
  local_58 = __return_storage_ptr__;
  if (this->prettyPrint == false) {
    sVar13 = 2;
    pcVar9 = ",";
  }
  else {
    pcVar5 = (char *)0x0;
    sVar13 = 3;
    pcVar9 = ", ";
    local_60 = (Repeat<char> *)multiline;
    if (1 < uVar1) {
      pcVar4 = "";
      pAVar11 = (ArrayDisposer *)0x0;
      if (bVar14 || hasMultilineElement) {
        pcVar4 = (char *)(ulong)(indent * 2 + 2);
        local_40 = ",\n";
        local_38 = (ArrayDisposer *)0x2;
        local_50.ptr = (char *)CONCAT71(local_50.ptr._1_7_,0x20);
        local_50.size_ = (size_t)pcVar4;
        kj::_::concat<kj::ArrayPtr<char_const>,kj::Repeat<char>>
                  ((String *)&local_98,(_ *)&local_40,&local_50,
                   (Repeat<char> *)CONCAT71(in_register_00000009,hasMultilineElement));
        if (pcVar15 != (char *)0x0) {
          (*(code *)*_DAT_00000000)(0,pcVar15,1,pAVar6,pAVar6,0,0,0);
          params_2 = pAVar6;
        }
        pcVar9 = (char *)local_98.size_;
        if ((ArrayPtr<const_char> *)local_98.text.content.ptr == (ArrayPtr<const_char> *)0x0) {
          pcVar9 = "";
        }
        local_c8 = (undefined8 *)local_98.text.content.size_;
        sVar13 = (long)(char **)local_98.text.content.ptr +
                 (ulong)((ArrayPtr<const_char> *)local_98.text.content.ptr ==
                        (ArrayPtr<const_char> *)0x0);
        local_60->value = '\x01';
        pcVar5 = (char *)0x1;
        pcVar10 = " ";
        pcVar15 = (char *)local_98.size_;
        pAVar6 = (ArrayPtr<const_char> *)local_98.text.content.ptr;
        if (hasPrefix) {
          local_40 = "\n";
          local_38 = (ArrayDisposer *)0x1;
          local_50.ptr = (char *)CONCAT71(local_50.ptr._1_7_,0x20);
          local_50.size_ = (size_t)pcVar4;
          kj::_::concat<kj::ArrayPtr<char_const>,kj::Repeat<char>>
                    ((String *)&local_98,(_ *)&local_40,&local_50,local_60);
          local_b8 = (char *)local_98.size_;
          pAStack_b0 = (ArrayPtr<const_char> *)local_98.text.content.ptr;
          pcVar4 = "";
          if ((ArrayPtr<const_char> *)local_98.text.content.ptr != (ArrayPtr<const_char> *)0x0) {
            pcVar4 = (char *)local_98.size_;
          }
          local_a8 = (undefined8 *)local_98.text.content.size_;
          pAVar11 = (ArrayDisposer *)
                    ((long)local_98.text.content.ptr +
                    ((ulong)((ArrayPtr<const_char> *)local_98.text.content.ptr ==
                            (ArrayPtr<const_char> *)0x0) - 1));
        }
        else {
          pcVar4 = " ";
          pAVar11 = (ArrayDisposer *)0x1;
        }
      }
      goto LAB_002f4598;
    }
  }
  pcVar5 = (char *)0x0;
  pcVar4 = "";
  pAVar11 = (ArrayDisposer *)0x0;
LAB_002f4598:
  delim.content.size_ = sVar13;
  delim.content.ptr = pcVar9;
  kj::StringTree::StringTree(&local_98,elements,delim);
  pSVar3 = local_58;
  local_50.ptr = pcVar10;
  local_50.size_ = (size_t)pcVar5;
  local_40 = pcVar4;
  local_38 = pAVar11;
  kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (local_58,(StringTree *)&local_40,(ArrayPtr<const_char> *)&local_98,
             (StringTree *)&local_50,params_2);
  sVar13 = local_98.branches.size_;
  pBVar2 = local_98.branches.ptr;
  if (local_98.branches.ptr != (Branch *)0x0) {
    local_98.branches.ptr = (Branch *)0x0;
    local_98.branches.size_ = 0;
    (**(local_98.branches.disposer)->_vptr_ArrayDisposer)
              (local_98.branches.disposer,pBVar2,0x40,sVar13,sVar13,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar13 = local_98.text.content.size_;
  pcVar10 = local_98.text.content.ptr;
  if ((ArrayPtr<const_char> *)local_98.text.content.ptr != (ArrayPtr<const_char> *)0x0) {
    local_98.text.content.ptr = (char *)0x0;
    local_98.text.content.size_ = 0;
    (**(local_98.text.content.disposer)->_vptr_ArrayDisposer)
              (local_98.text.content.disposer,pcVar10,1,sVar13,sVar13,0);
  }
  if (pcVar15 != (char *)0x0) {
    (**(code **)*local_c8)(local_c8,pcVar15,1,pAVar6,pAVar6,0,0,0);
  }
  if (local_b8 != (char *)0x0) {
    (**(code **)*local_a8)(local_a8,local_b8,1,pAStack_b0,pAStack_b0,0);
  }
  return pSVar3;
}

Assistant:

kj::StringTree encodeList(kj::Array<kj::StringTree> elements,
                            bool hasMultilineElement, uint indent, bool& multiline,
                            bool hasPrefix) const {
    size_t maxChildSize = 0;
    for (auto& e: elements) maxChildSize = kj::max(maxChildSize, e.size());

    kj::StringPtr prefix;
    kj::StringPtr delim;
    kj::StringPtr suffix;
    kj::String ownPrefix;
    kj::String ownDelim;
    if (!prettyPrint) {
      // No whitespace.
      delim = ",";
      prefix = "";
      suffix = "";
    } else if ((elements.size() > 1) && (hasMultilineElement || maxChildSize > 50)) {
      // If the array contained any multi-line elements, OR it contained sufficiently long
      // elements, then put each element on its own line.
      auto indentSpace = kj::repeat(' ', (indent + 1) * 2);
      delim = ownDelim = kj::str(",\n", indentSpace);
      multiline = true;
      if (hasPrefix) {
        // We're producing a multi-line list, and the first line has some garbage in front of it.
        // Therefore, move the first element to the next line.
        prefix = ownPrefix = kj::str("\n", indentSpace);
      } else {
        prefix = " ";
      }
      suffix = " ";
    } else {
      // Put everything on one line, but add spacing between elements for legibility.
      delim = ", ";
      prefix = "";
      suffix = "";
    }

    return kj::strTree(prefix, kj::StringTree(kj::mv(elements), delim), suffix);
  }